

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeUpdate(ImGuiDockNode *node)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ImGuiViewportP *pIVar7;
  ImDrawList *pIVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  ImGuiViewportFlags IVar19;
  ImGuiViewportFlags IVar20;
  ImGuiContext *pIVar21;
  int iVar23;
  bool bVar22;
  ImU32 IVar24;
  ImGuiID IVar25;
  ImGuiID IVar26;
  ImGuiID IVar27;
  ImGuiContext *g;
  ImVec2 IVar28;
  ImGuiWindow *pIVar29;
  ImGuiTabItem *pIVar30;
  ulong uVar31;
  ImGuiID *pIVar32;
  short sVar33;
  float fVar34;
  int iVar35;
  ulong uVar36;
  ImVec2 *pIVar37;
  ImGuiDockNode *pIVar38;
  ImGuiDockNode *pIVar39;
  char *pcVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  ImGuiWindow *pIVar44;
  ImVec4 *pIVar45;
  ImGuiContext *pIVar46;
  long lVar47;
  ImGuiTabBar *this;
  byte bVar48;
  char cVar49;
  undefined8 uVar50;
  ImGuiDockNode *pIVar51;
  ImGuiPayload *pIVar52;
  bool bVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  ImRect outer;
  ImRect inner;
  ImRect title_bar_rect;
  bool tab_open;
  ImGuiDockNodeTreeInfo info;
  ImVec2 close_button_pos;
  ImVec2 window_menu_button_pos;
  ImRect tab_bar_rect;
  uint local_174;
  ImRect local_138;
  ImGuiContext *local_120;
  ImVec2 local_118;
  undefined8 uStack_110;
  ImGuiTabBar *local_100;
  ImVec2 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e0;
  ImVec4 local_d8;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ImGuiDockNode *local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImRect local_48;
  
  pIVar46 = GImGui;
  if (node->LastFrameActive == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3665,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  node->LastFrameAlive = GImGui->FrameCount;
  node->field_0xbe = node->field_0xbe & 0xf7;
  node->CentralNode = (ImGuiDockNode *)0x0;
  node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node);
    local_b8._0_4_ = 0;
    local_b8._4_4_ = 0;
    local_c8._0_4_ = 0.0;
    local_c8._4_4_ = 0.0;
    uStack_c0 = (ImGuiDockNode *)0x0;
    DockNodeFindInfo(node,(ImGuiDockNodeTreeInfo *)local_c8);
    node->CentralNode = (ImGuiDockNode *)local_c8;
    pIVar51 = (ImGuiDockNode *)0x0;
    if ((int)local_b8 == 1) {
      pIVar51 = uStack_c0;
    }
    node->OnlyNodeWithWindows = pIVar51;
    node->CountNodeWithWindows = (int)local_b8;
    if (uStack_c0 != (ImGuiDockNode *)0x0 && node->LastFocusedNodeId == 0) {
      node->LastFocusedNodeId = uStack_c0->ID;
    }
    IVar28 = (ImVec2)local_c8;
    if (uStack_c0 != (ImGuiDockNode *)0x0) {
      if ((uStack_c0->Windows).Size < 1) goto LAB_00143192;
      pIVar29 = *(uStack_c0->Windows).Data;
      IVar27 = (pIVar29->WindowClass).ClassId;
      IVar25 = (pIVar29->WindowClass).ParentViewportId;
      IVar19 = (pIVar29->WindowClass).ViewportFlagsOverrideSet;
      IVar20 = (pIVar29->WindowClass).ViewportFlagsOverrideClear;
      uVar9 = *(undefined4 *)((long)&(pIVar29->WindowClass).ViewportFlagsOverrideClear + 2);
      uVar10 = *(undefined4 *)((long)&(pIVar29->WindowClass).TabItemFlagsOverrideSet + 2);
      uVar11 = *(undefined4 *)((long)&(pIVar29->WindowClass).DockNodeFlagsOverrideSet + 2);
      *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) =
           *(undefined4 *)((long)&(pIVar29->WindowClass).ViewportFlagsOverrideSet + 2);
      *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar9;
      *(undefined4 *)((long)&(node->WindowClass).TabItemFlagsOverrideSet + 2) = uVar10;
      *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar11;
      (node->WindowClass).ClassId = IVar27;
      (node->WindowClass).ParentViewportId = IVar25;
      (node->WindowClass).ViewportFlagsOverrideSet = IVar19;
      (node->WindowClass).ViewportFlagsOverrideClear = IVar20;
      lVar43 = (long)(uStack_c0->Windows).Size;
      if (1 < lVar43) {
        lVar47 = 1;
        do {
          pIVar29 = (uStack_c0->Windows).Data[lVar47];
          if ((pIVar29->WindowClass).DockingAllowUnclassed == false) {
            IVar27 = (pIVar29->WindowClass).ClassId;
            IVar25 = (pIVar29->WindowClass).ParentViewportId;
            IVar19 = (pIVar29->WindowClass).ViewportFlagsOverrideSet;
            IVar20 = (pIVar29->WindowClass).ViewportFlagsOverrideClear;
            uVar9 = *(undefined4 *)((long)&(pIVar29->WindowClass).ViewportFlagsOverrideClear + 2);
            uVar10 = *(undefined4 *)((long)&(pIVar29->WindowClass).TabItemFlagsOverrideSet + 2);
            uVar11 = *(undefined4 *)((long)&(pIVar29->WindowClass).DockNodeFlagsOverrideSet + 2);
            *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) =
                 *(undefined4 *)((long)&(pIVar29->WindowClass).ViewportFlagsOverrideSet + 2);
            *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar9;
            *(undefined4 *)((long)&(node->WindowClass).TabItemFlagsOverrideSet + 2) = uVar10;
            *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar11;
            (node->WindowClass).ClassId = IVar27;
            (node->WindowClass).ParentViewportId = IVar25;
            (node->WindowClass).ViewportFlagsOverrideSet = IVar19;
            (node->WindowClass).ViewportFlagsOverrideClear = IVar20;
            break;
          }
          lVar47 = lVar47 + 1;
        } while (lVar43 != lVar47);
      }
    }
    for (; IVar28 != (ImVec2)0x0; IVar28 = *(ImVec2 *)((long)IVar28 + 0x18)) {
      *(byte *)((long)IVar28 + 0xbd) = *(byte *)((long)IVar28 + 0xbd) | 0x20;
    }
  }
  if ((node->TabBar != (ImGuiTabBar *)0x0) && ((node->MergedFlags & 0x1000) != 0)) {
    IM_DELETE<ImGuiTabBar>(node->TabBar);
    node->TabBar = (ImGuiTabBar *)0x0;
  }
  bVar53 = node->ParentNode == (ImGuiDockNode *)0x0;
  uVar2 = node->MergedFlags;
  if ((uVar2 >> 10 & 1) == 0 && bVar53) {
    iVar23 = (node->Windows).Size;
    if (((iVar23 < 2) && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)) &&
       ((pIVar46->IO).ConfigDockingAlwaysTabBar == false)) {
      if (iVar23 != 0) {
        if (iVar23 != 1) {
LAB_00143192:
          pcVar40 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_001431a7:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                        ,0x706,pcVar40);
        }
        if (((*(node->Windows).Data)->WindowClass).DockingAlwaysTabBar != false) goto LAB_001419c9;
      }
      bVar22 = true;
    }
    else {
LAB_001419c9:
      bVar22 = false;
    }
    if ((bVar22) || (node->CountNodeWithWindows == 0)) {
      if (iVar23 == 1) {
        pIVar29 = *(node->Windows).Data;
        node->Pos = pIVar29->Pos;
        node->Size = pIVar29->SizeFull;
        *(ushort *)&node->field_0xbc = (ushort)*(undefined4 *)&node->field_0xbc & 0xfe00 | 0x92;
        if ((node->HostWindow != (ImGuiWindow *)0x0) && (pIVar46->NavWindow == node->HostWindow)) {
          FocusWindow(pIVar29);
        }
        pIVar44 = node->HostWindow;
        if (pIVar44 != (ImGuiWindow *)0x0) {
          pIVar7 = pIVar44->Viewport;
          pIVar29->Viewport = pIVar7;
          pIVar29->ViewportId = pIVar44->ViewportId;
          if (pIVar44->ViewportOwned == true) {
            pIVar7->Window = pIVar29;
            pIVar29->ViewportOwned = true;
          }
        }
      }
      DockNodeHideHostWindow(node);
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
      node->WantCloseTabId = 0;
      node->field_0xbd = node->field_0xbd & 0xa7;
      node->LastFrameActive = pIVar46->FrameCount;
      if ((node->field_0xbe & 1) == 0) {
        return;
      }
      if ((node->Windows).Size != 1) {
        return;
      }
      DockNodeStartMouseMovingWindow(node,*(node->Windows).Data);
      return;
    }
  }
  if ((((*(uint *)&node->field_0xbc >> 9 & 1) != 0) &&
      (((uVar2 >> 10 & 1) == 0 && bVar53) && node->HostWindow == (ImGuiWindow *)0x0)) &&
     (node->ChildNodes[0] == (ImGuiDockNode *)0x0)) {
    uVar3 = (node->Windows).Size;
    if ((int)uVar3 < 1) {
      __assert_fail("node->Windows.Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x36ac,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    if (node->SelectedTabId != 0) {
      uVar36 = 0;
      do {
        pIVar29 = (node->Windows).Data[uVar36];
        if (pIVar29->ID == node->SelectedTabId) goto LAB_00141c05;
        uVar36 = uVar36 + 1;
      } while (uVar3 != uVar36);
    }
    pIVar29 = (ImGuiWindow *)0x0;
LAB_00141c05:
    if (pIVar29 == (ImGuiWindow *)0x0) {
      pIVar29 = *(node->Windows).Data;
    }
    if (('\0' < pIVar29->AutoFitFramesX) || ('\0' < pIVar29->AutoFitFramesY)) {
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
      return;
    }
  }
  uVar3 = (node->Windows).Size;
  uVar36 = (ulong)uVar3;
  *(ushort *)&node->field_0xbc =
       (ushort)*(uint *)&node->field_0xbc & 0xe7ff |
       (ushort)((uVar2 >> 0xe & 1) == 0 && 0 < (int)uVar3) << 0xc;
  if ((int)uVar3 < 1) {
    bVar53 = false;
  }
  else {
    lVar43 = 0;
    do {
      pIVar29 = (node->Windows).Data[lVar43];
      iVar23._0_1_ = pIVar29->HasCloseButton;
      iVar23._1_1_ = pIVar29->ResizeBorderHeld;
      iVar23._2_2_ = pIVar29->BeginCount;
      *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc | (ushort)(iVar23 << 0xb);
      pIVar29->field_0x3e1 = pIVar29->field_0x3e1 & 0xfe | 1 < (int)uVar36;
      lVar43 = lVar43 + 1;
      iVar23 = (node->Windows).Size;
      uVar36 = (ulong)iVar23;
    } while (lVar43 < (long)uVar36);
    bVar53 = 0 < iVar23;
  }
  if ((short)uVar2 < 0) {
    node->field_0xbd = node->field_0xbd & 0xf7;
  }
  pIVar21 = GImGui;
  if ((node->MergedFlags & 0x400) == 0) {
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      if ((*(uint *)&node->field_0xbc >> 9 & 1) == 0) {
        uVar50 = 0;
        pIVar29 = (ImGuiWindow *)0x0;
      }
      else {
        if (bVar53) {
          pIVar29 = *(node->Windows).Data;
        }
        else {
          pIVar29 = (ImGuiWindow *)0x0;
        }
        uVar3 = *(uint *)&node->field_0xbc & 7;
        pIVar44 = pIVar29;
        if ((uVar3 == 2 && pIVar29 != (ImGuiWindow *)0x0) ||
           (pIVar44 = (ImGuiWindow *)node, uVar3 == 1)) {
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar21->NextWindowData).PosVal = pIVar44->Pos;
          (pIVar21->NextWindowData).PosPivotVal.x = 0.0;
          (pIVar21->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar21->NextWindowData).PosCond = 1;
          (pIVar21->NextWindowData).PosUndock = true;
        }
        pIVar21 = GImGui;
        sVar33 = (short)((uint)(int)(short)(*(int *)&node->field_0xbc << 10) >> 0xd);
        if (sVar33 == 2 && pIVar29 != (ImGuiWindow *)0x0) {
          pIVar37 = &pIVar29->SizeFull;
LAB_00141cfc:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
          (pIVar21->NextWindowData).SizeVal = *pIVar37;
          (pIVar21->NextWindowData).SizeCond = 1;
        }
        else if (sVar33 == 1) {
          pIVar37 = &node->Size;
          goto LAB_00141cfc;
        }
        pIVar21 = GImGui;
        if ((*(ushort *)&node->field_0xbc & 0x38) == 0x10 && pIVar29 != (ImGuiWindow *)0x0) {
          bVar53 = pIVar29->Collapsed;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 8;
          (pIVar21->NextWindowData).CollapsedVal = bVar53;
          (pIVar21->NextWindowData).CollapsedCond = 1;
        }
        pIVar21 = GImGui;
        if ((*(ushort *)&node->field_0xbc & 0x1c0) == 0x80 && pIVar29 != (ImGuiWindow *)0x0) {
          IVar27 = pIVar29->ViewportId;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 0x100;
          (pIVar21->NextWindowData).ViewportId = IVar27;
        }
        SetNextWindowClass(&node->WindowClass);
        ImFormatString(local_c8,0x14,"##DockNode_%02X",(ulong)node->ID);
        local_138.Min.x = 0.0;
        local_138.Min.y = 0.0;
        PushStyleVar(2,&local_138.Min);
        Begin(local_c8,(bool *)0x0,0x20081139);
        PopStyleVar(1);
        pIVar29 = pIVar46->CurrentWindow;
        pIVar44 = node->HostWindow;
        if ((pIVar44 != pIVar29 && pIVar44 != (ImGuiWindow *)0x0) &&
           (pIVar44->DockNodeAsHost == node)) {
          pIVar44->DockNodeAsHost = (ImGuiDockNode *)0x0;
        }
        pIVar29->DockNodeAsHost = node;
        node->HostWindow = pIVar29;
        IVar28 = pIVar29->Pos;
        (pIVar29->DC).CursorPos = IVar28;
        node->Pos = IVar28;
        node->Size = pIVar29->Size;
        if (node->HostWindow->Appearing == true) {
          BringWindowToDisplayFront(node->HostWindow);
        }
        *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xfe00;
        uVar50 = CONCAT71((int7)((ulong)local_c8 >> 8),1);
      }
    }
    else {
      pIVar29 = node->ParentNode->HostWindow;
      node->HostWindow = pIVar29;
      *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xfe00;
      uVar50 = 0;
    }
    if (((node->field_0xbe & 1) != 0) && (node->HostWindow != (ImGuiWindow *)0x0)) {
      DockNodeStartMouseMovingWindow(node,node->HostWindow);
    }
  }
  else {
    pIVar29 = node->HostWindow;
    if (pIVar29 == (ImGuiWindow *)0x0) {
      __assert_fail("node->HostWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x36ce,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    uVar50 = 0;
  }
  if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) && (node->TabBar != (ImGuiTabBar *)0x0)) {
    __assert_fail("node->TabBar == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3717,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (pIVar46->NavWindow != (ImGuiWindow *)0x0)) {
    pIVar44 = pIVar46->NavWindow->RootWindow;
    pIVar51 = pIVar44->DockNode;
    if ((pIVar51 != (ImGuiDockNode *)0x0) && (pIVar44->ParentWindow == pIVar29)) {
      node->LastFocusedNodeId = pIVar51->ID;
    }
  }
  local_120 = pIVar46;
  cVar49 = '\0';
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (cVar49 = '\0', pIVar29 != (ImGuiWindow *)0x0))
  {
    cVar49 = (char)((uVar2 & 8) >> 3);
  }
  local_e0 = uVar50;
  if (cVar49 != '\0') {
    ImDrawListSplitter::Split(&pIVar29->DrawList->_Splitter,pIVar29->DrawList,2);
    ImDrawListSplitter::SetCurrentChannel(&pIVar29->DrawList->_Splitter,pIVar29->DrawList,1);
  }
  pIVar51 = node->CentralNode;
  bVar53 = false;
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (bVar53 = false, pIVar29 != (ImGuiWindow *)0x0))
  {
    if ((pIVar51 != (ImGuiDockNode *)0x0 & (byte)uVar2 >> 3) == 1) {
      bVar53 = (pIVar51->Windows).Size == 0 && pIVar51->ChildNodes[0] == (ImGuiDockNode *)0x0;
    }
    else {
      bVar53 = false;
    }
  }
  bVar22 = bVar53;
  if (bVar53) {
    pIVar52 = (ImGuiPayload *)0x0;
    if (GImGui->DragDropActive != false) {
      pIVar52 = &GImGui->DragDropPayload;
    }
    if (((GImGui->DragDropActive == true) && (pIVar52->DataFrameCount != -1)) &&
       (iVar23 = strcmp("_IMWINDOW",pIVar52->DataType), iVar23 == 0)) {
      bVar22 = DockNodeIsDropAllowed(pIVar29,*pIVar52->Data);
      bVar22 = (bool)(!bVar22 & bVar53);
    }
  }
  if (bVar22) {
    pIVar39 = pIVar51;
    if ((node->MergedFlags & 0x400) == 0) {
      __assert_fail("node->IsDockSpace()",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3732,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    do {
      pIVar38 = pIVar39;
      pIVar39 = pIVar38->ParentNode;
    } while (pIVar38->ParentNode != (ImGuiDockNode *)0x0);
    fVar34 = (pIVar38->Pos).x;
    fVar54 = (pIVar38->Pos).y;
    fVar55 = (pIVar51->Pos).x + (pIVar51->Size).x;
    fVar56 = (pIVar51->Pos).y + (pIVar51->Size).y;
    local_c8 = *(undefined1 (*) [8])&pIVar51->Pos;
    if (fVar34 < (float)local_c8._0_4_) {
      local_c8._0_4_ = (float)local_c8._0_4_ + 4.0;
    }
    if (fVar55 < (pIVar38->Size).x + fVar34) {
      fVar55 = fVar55 + -4.0;
    }
    if (fVar54 < (float)local_c8._4_4_) {
      local_c8._4_4_ = (float)local_c8._4_4_ + 4.0;
    }
    if (fVar56 < (pIVar38->Size).y + fVar54) {
      fVar56 = fVar56 + -4.0;
    }
    uStack_c0 = (ImGuiDockNode *)CONCAT44(fVar56,fVar55);
    if (((bVar53) && ((float)local_c8._0_4_ <= fVar55)) && ((float)local_c8._4_4_ <= fVar56)) {
      local_138.Min.y = fVar56 - (float)local_c8._4_4_;
      local_138.Min.x = fVar55 - (float)local_c8._0_4_;
      SetWindowHitTestHole(pIVar29,(ImVec2 *)local_c8,&local_138.Min);
      local_138.Min.y = uStack_c0._4_4_ - (float)local_c8._4_4_;
      local_138.Min.x = (float)uStack_c0 - (float)local_c8._0_4_;
      SetWindowHitTestHole(pIVar29->ParentWindow,(ImVec2 *)local_c8,&local_138.Min);
    }
  }
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (pIVar29 != (ImGuiWindow *)0x0)) {
    DockNodeTreeUpdatePosSize(node,pIVar29->Pos,pIVar29->Size,false);
    DockNodeTreeUpdateSplitter(node);
  }
  if ((((pIVar29 != (ImGuiWindow *)0x0) && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)) &&
      ((node->Windows).Size == 0)) && (((uVar2 & 8) == 0 & (byte)node->field_0xbd >> 1) == 1)) {
    pIVar8 = pIVar29->DrawList;
    local_138.Min.y = (node->Pos).y + (node->Size).y;
    local_138.Min.x = (node->Pos).x + (node->Size).x;
    local_c8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 0x27);
    uVar12 = (GImGui->Style).Colors[0x27].z;
    uVar13 = (GImGui->Style).Colors[0x27].w;
    uStack_c0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar13,uVar12);
    IVar24 = ColorConvertFloat4ToU32((ImVec4 *)local_c8);
    ImDrawList::AddRectFilled(pIVar8,&node->Pos,&local_138.Min,IVar24,0.0,0);
  }
  pIVar46 = local_120;
  if ((cVar49 != '\0') && ((node->field_0xbd & 2) != 0)) {
    ImDrawListSplitter::SetCurrentChannel(&pIVar29->DrawList->_Splitter,pIVar29->DrawList,0);
    pIVar8 = pIVar29->DrawList;
    if (bVar53) {
      outer.Max.x = (node->Pos).x + (node->Size).x;
      inner.Max.x = (pIVar51->Pos).x + (pIVar51->Size).x;
      outer.Max.y = (node->Pos).y + (node->Size).y;
      inner.Max.y = (pIVar51->Pos).y + (pIVar51->Size).y;
      local_118 = pIVar51->Pos;
      uStack_110 = 0;
      local_f8 = node->Pos;
      uStack_f0 = 0;
      local_c8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar14 = (GImGui->Style).Colors[2].z;
      uVar15 = (GImGui->Style).Colors[2].w;
      uStack_c0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar15,uVar14);
      IVar24 = ColorConvertFloat4ToU32((ImVec4 *)local_c8);
      outer.Min = local_f8;
      inner.Min = local_118;
      RenderRectFilledWithHole(pIVar8,outer,inner,IVar24,0.0);
    }
    else {
      local_138.Min.y = (node->Pos).y + (node->Size).y;
      local_138.Min.x = (node->Pos).x + (node->Size).x;
      local_c8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar16 = (GImGui->Style).Colors[2].z;
      uVar17 = (GImGui->Style).Colors[2].w;
      uStack_c0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar17,uVar16);
      IVar24 = ColorConvertFloat4ToU32((ImVec4 *)local_c8);
      ImDrawList::AddRectFilled(pIVar8,&node->Pos,&local_138.Min,IVar24,0.0,0);
    }
    ImDrawListSplitter::Merge(&pIVar29->DrawList->_Splitter,pIVar29->DrawList);
  }
  pIVar21 = GImGui;
  if ((pIVar29 == (ImGuiWindow *)0x0) || ((node->Windows).Size < 1)) {
    node->WantCloseTabId = 0;
    node->field_0xbd = node->field_0xbd & 0xbb;
  }
  else {
    IVar27 = node->WantCloseTabId;
    iVar23 = GImGui->FrameCount;
    uVar1 = *(ushort *)&node->field_0xbc;
    *(ushort *)&node->field_0xbc = uVar1 & 0xbfff;
    node->WantCloseTabId = 0;
    pIVar51 = node;
    do {
      pIVar39 = pIVar51;
      pIVar51 = pIVar39->ParentNode;
    } while (pIVar39->ParentNode != (ImGuiDockNode *)0x0);
    iVar41 = node->LastFrameActive + 1;
    if (pIVar21->NavWindowingTarget == (ImGuiWindow *)0x0) {
      if ((pIVar21->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar21->NavWindow->RootWindowForTitleBarHighlight == pIVar29->RootWindowDockTree)) {
        bVar53 = pIVar39->LastFocusedNodeId == node->ID;
        goto LAB_0014245b;
      }
      local_174 = 0;
    }
    else {
      bVar53 = pIVar21->NavWindowingTarget->DockNode == node;
LAB_0014245b:
      local_174 = (uint)bVar53;
    }
    bVar48 = (byte)local_174;
    if ((node->MergedFlags & 0x3000U) == 0) {
      local_118.x = (float)(uint)uVar1;
      bVar53 = pIVar29->SkipItems;
      if (((uint)node->MergedFlags >> 10 & 1) == 0) {
        pIVar29->SkipItems = false;
        (pIVar29->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      }
      PushOverrideID(node->ID);
      this = node->TabBar;
      local_100 = this;
      if (this == (ImGuiTabBar *)0x0) {
        DockNodeAddTabBar(node);
        this = node->TabBar;
      }
      *(ushort *)&node->field_0xbc =
           (ushort)*(undefined4 *)&node->field_0xbc & 0xfbff | (ushort)(local_174 << 10);
      local_f8.x = 0.0;
      local_f8.y = 0.0;
      if ((node->MergedFlags & 0x4000) == 0) {
        local_f8._1_7_ = (undefined7)((ulong)pIVar21 >> 8);
        local_f8.x._0_1_ = (pIVar21->Style).WindowMenuButtonPosition != -1;
      }
      local_60 = pIVar39;
      if (local_f8.x._0_1_ == '\0') {
LAB_0014270a:
        IVar25 = 0;
      }
      else {
        IVar25 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
        bVar22 = IsPopupOpen(IVar25,0);
        pIVar46 = GImGui;
        if (!bVar22) goto LAB_0014270a;
        if ((GImGui->Style).WindowMenuButtonPosition == 0) {
          fVar34 = (GImGui->Style).FramePadding.y;
          fVar54 = fVar34 + fVar34 + GImGui->FontSize + (node->Pos).y;
          fVar34 = (node->Pos).x;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar46->NextWindowData).PosVal.x = fVar34;
          fVar34 = 0.0;
        }
        else {
          fVar34 = (node->Pos).x;
          fVar56 = (node->Size).x;
          fVar54 = (GImGui->Style).FramePadding.y;
          fVar54 = fVar54 + fVar54 + GImGui->FontSize + (node->Pos).y;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar46->NextWindowData).PosVal.x = fVar34 + fVar56;
          fVar34 = 1.0;
        }
        (pIVar46->NextWindowData).PosVal.y = fVar54;
        (pIVar46->NextWindowData).PosPivotVal.x = fVar34;
        (pIVar46->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar46->NextWindowData).PosCond = 1;
        (pIVar46->NextWindowData).PosUndock = true;
        bVar22 = BeginPopup("#WindowMenu",0);
        IVar26 = 0;
        if (bVar22) {
          node->field_0xbd = node->field_0xbd | 4;
          iVar4 = (this->Tabs).Size;
          if (iVar4 == 1) {
            bVar22 = MenuItem("Hide tab bar",(char *)0x0,
                              (bool)((byte)((uint)node->MergedFlags >> 0xd) & 1),true);
            if (bVar22) {
              node->field_0xbe = node->field_0xbe | 4;
            }
LAB_001428de:
            IVar26 = 0;
          }
          else {
            if (iVar4 < 1) goto LAB_001428de;
            lVar47 = 0;
            lVar43 = 0;
            IVar26 = 0;
            do {
              pIVar30 = (this->Tabs).Data;
              if ((*(byte *)((long)&pIVar30->Flags + lVar47 + 2) & 0x20) == 0) {
                pIVar30 = (ImGuiTabItem *)((long)&pIVar30->ID + lVar47);
                pcVar40 = ImGuiTabBar::GetTabName(this,pIVar30);
                local_c8._0_4_ = 0.0;
                local_c8._4_4_ = 0.0;
                bVar22 = Selectable(pcVar40,pIVar30->ID == this->SelectedTabId,0,(ImVec2 *)local_c8)
                ;
                pIVar46 = GImGui;
                if (bVar22) {
                  IVar26 = pIVar30->ID;
                }
                pIVar44 = GImGui->CurrentWindow;
                pIVar44->WriteAccessed = true;
                if (pIVar44->SkipItems == false) {
                  (pIVar44->DC).CursorPos.x =
                       (pIVar46->Style).ItemSpacing.x + (pIVar44->DC).CursorPosPrevLine.x;
                  (pIVar44->DC).CursorPos.y = (pIVar44->DC).CursorPosPrevLine.y;
                  (pIVar44->DC).CurrLineSize = (pIVar44->DC).PrevLineSize;
                  (pIVar44->DC).CurrLineTextBaseOffset = (pIVar44->DC).PrevLineTextBaseOffset;
                }
                Text("   ");
              }
              lVar43 = lVar43 + 1;
              lVar47 = lVar47 + 0x30;
            } while (lVar43 < (this->Tabs).Size);
          }
          EndPopup();
        }
        IVar25 = 0;
        if (IVar26 != 0) {
          this->NextSelectedTabId = IVar26;
          IVar25 = IVar26;
        }
        local_174 = (uint)(byte)(bVar48 | (node->field_0xbd & 4) >> 2);
      }
      local_138.Min.x = 0.0;
      local_138.Min.y = 0.0;
      local_138.Max.x = 0.0;
      local_138.Max.y = 0.0;
      local_48.Min.x = 0.0;
      local_48.Min.y = 0.0;
      local_48.Max.x = 0.0;
      local_48.Max.y = 0.0;
      local_50.x = 0.0;
      local_50.y = 0.0;
      local_58.x = 0.0;
      local_58.y = 0.0;
      DockNodeCalcTabBarLayout(node,&local_138,&local_48,&local_50,&local_58);
      iVar4 = (this->Tabs).Size;
      if (0 < (node->Windows).Size) {
        lVar43 = 0;
        do {
          pIVar44 = (node->Windows).Data[lVar43];
          pIVar30 = TabBarFindTabByID(this,pIVar44->ID);
          if (pIVar30 == (ImGuiTabItem *)0x0) {
            TabBarAddTab(this,0x400000,pIVar44);
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 < (node->Windows).Size);
      }
      iVar35 = 10;
      if ((char)local_174 != '\0') {
        node->LastFrameFocused = pIVar21->FrameCount;
        iVar35 = 0xb;
      }
      iVar42 = 0xc;
      if (pIVar29->Collapsed == false) {
        iVar42 = iVar35;
      }
      pIVar37 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar42 << 4));
      local_c8 = *(undefined1 (*) [8])pIVar37;
      IVar28 = pIVar37[1];
      uStack_c0._4_4_ = IVar28.y;
      uStack_c0._0_4_ = IVar28.x;
      uStack_c0 = (ImGuiDockNode *)
                  CONCAT44((GImGui->Style).Alpha * uStack_c0._4_4_,(float)uStack_c0);
      IVar24 = ColorConvertFloat4ToU32((ImVec4 *)local_c8);
      ImDrawList::AddRectFilled
                (pIVar29->DrawList,&local_138.Min,&local_138.Max,IVar24,pIVar29->WindowRounding,0x30
                );
      if (local_f8.x._0_1_ != '\0') {
        IVar26 = ImGuiWindow::GetID(pIVar29,"#COLLAPSE",(char *)0x0);
        bVar22 = CollapseButton(IVar26,&local_50,node);
        if (bVar22) {
          IVar26 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
          OpenPopupEx(IVar26,0);
        }
        if ((GImGui->ActiveId != 0) && (GImGui->ActiveId == (GImGui->LastItemData).ID)) {
          IVar25 = this->SelectedTabId;
        }
      }
      uVar2 = (this->Tabs).Size;
      uVar31 = (ulong)(int)uVar2;
      uVar36 = (ulong)uVar2;
      if (0 < (long)uVar31) {
        lVar43 = uVar31 * 0x30 + -0x2c;
        uVar36 = uVar31;
        do {
          if ((long)(this->Tabs).Size < (long)uVar36) {
            pcVar40 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
            goto LAB_001431a7;
          }
          pIVar30 = (this->Tabs).Data;
          uVar3 = *(uint *)((long)&pIVar30->ID + lVar43);
          if ((uVar3 >> 0x16 & 1) == 0) goto LAB_00142ae0;
          *(uint *)((long)&pIVar30->ID + lVar43) = uVar3 & 0xffbfffff;
          lVar43 = lVar43 + -0x30;
          bVar22 = 1 < (long)uVar36;
          uVar36 = uVar36 - 1;
        } while (bVar22);
        uVar36 = 0;
      }
LAB_00142ae0:
      iVar35 = (int)uVar36;
      if ((uVar2 - iVar35 != 0 && iVar35 <= (int)uVar2) && iVar35 + 1 < (int)uVar2) {
        qsort((this->Tabs).Data + iVar35,(long)(int)(uVar2 - iVar35),0x30,TabItemComparerByDockOrder
             );
      }
      if ((pIVar21->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar44 = pIVar21->NavWindow->RootWindow, pIVar44->DockNode == node)) {
        this->SelectedTabId = pIVar44->ID;
      }
      if (local_100 == (ImGuiTabBar *)0x0) {
        pIVar30 = TabBarFindTabByID(this,node->SelectedTabId);
        if (pIVar30 == (ImGuiTabItem *)0x0) goto LAB_00142b51;
        pIVar32 = &node->SelectedTabId;
        fVar34 = local_118.x;
LAB_00142b98:
        IVar26 = *pIVar32;
        this->NextSelectedTabId = IVar26;
        this->SelectedTabId = IVar26;
      }
      else {
LAB_00142b51:
        uVar2 = (this->Tabs).Size;
        fVar34 = local_118.x;
        if (iVar4 < (int)uVar2) {
          if ((int)uVar2 < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                          ,0x70f,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
          }
          pIVar32 = &((this->Tabs).Data[(ulong)uVar2 - 1].Window)->ID;
          goto LAB_00142b98;
        }
      }
      IVar28 = local_118;
      local_118.x._1_3_ = (uint3)((uint)fVar34 >> 0x16);
      local_118.x._0_1_ = (byte)((uint)fVar34 >> 0xe) & iVar41 == iVar23;
      local_118.y = IVar28.y;
      local_f8.x = (float)(uint)(IVar27 != 0 && iVar41 == iVar23);
      uVar2 = local_174 << 0x15 | 0x500003;
      if (pIVar29->Collapsed != false) {
        uVar2 = 0x500003;
      }
      BeginTabBarEx(this,&local_48,uVar2,node);
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      uStack_b0 = 0;
      local_c8._0_4_ = 0.0;
      local_c8._4_4_ = 0.0;
      uStack_c0 = (ImGuiDockNode *)0x0;
      lVar43 = 0;
      do {
        pIVar45 = (pIVar21->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar43);
        uVar50 = *(undefined8 *)&pIVar45->z;
        *(undefined8 *)(local_c8 + lVar43 * 4) = *(undefined8 *)pIVar45;
        *(undefined8 *)((long)&uStack_c0 + lVar43 * 4) = uVar50;
        lVar43 = lVar43 + 4;
      } while (lVar43 != 0x18);
      node->VisibleWindow = (ImGuiWindow *)0x0;
      if (0 < (node->Windows).Size) {
        local_100 = (ImGuiTabBar *)&(pIVar21->LastItemData).Rect;
        lVar43 = 0;
        fVar34 = local_118.x;
        do {
          pIVar44 = (node->Windows).Data[lVar43];
          if (((((SUB41(fVar34,0) == '\0') && ((float)pIVar44->ID != local_f8.x)) ||
               (pIVar44->HasCloseButton != true)) || ((pIVar44->Flags & 0x100000) != 0)) &&
             (pIVar21->FrameCount <= pIVar44->LastFrameActive + 1 || iVar41 != iVar23)) {
            uVar2 = pIVar44->Flags;
            uVar3 = (pIVar44->WindowClass).TabItemFlagsOverrideSet;
            uVar5 = this->Flags;
            lVar47 = 0;
            do {
              uVar6 = *(uint *)((long)(pIVar44->DockStyle).Colors + lVar47);
              pIVar45 = (pIVar21->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar47);
              pIVar45->x = (float)(uVar6 & 0xff) * 0.003921569;
              pIVar45->y = (float)(uVar6 >> 8 & 0xff) * 0.003921569;
              pIVar45->z = (float)(uVar6 >> 0x10 & 0xff) * 0.003921569;
              pIVar45->w = (float)(uVar6 >> 0x18) * 0.003921569;
              lVar47 = lVar47 + 4;
            } while (lVar47 != 0x18);
            local_d8.x = (float)CONCAT31(local_d8.x._1_3_,1);
            pIVar45 = (ImVec4 *)0x0;
            if (pIVar44->HasCloseButton != false) {
              pIVar45 = &local_d8;
            }
            TabItemEx(this,pIVar44->Name,(bool *)pIVar45,uVar5 >> 1 & 4 | uVar2 >> 0x14 & 1 | uVar3,
                      pIVar44);
            if (local_d8.x._0_1_ == '\0') {
              node->WantCloseTabId = pIVar44->ID;
            }
            IVar27 = pIVar44->ID;
            if (this->VisibleTabId == IVar27) {
              node->VisibleWindow = pIVar44;
            }
            pIVar44->DockTabItemStatusFlags = (pIVar21->LastItemData).StatusFlags;
            iVar4 = (local_100->Tabs).Capacity;
            IVar28 = *(ImVec2 *)&(local_100->Tabs).Data;
            (pIVar44->DockTabItemRect).Min.x = (float)(local_100->Tabs).Size;
            (pIVar44->DockTabItemRect).Min.y = (float)iVar4;
            (pIVar44->DockTabItemRect).Max = IVar28;
            fVar34 = local_118.x;
            if (((pIVar21->NavWindow != (ImGuiWindow *)0x0) &&
                (pIVar21->NavWindow->RootWindow == pIVar44)) &&
               (((pIVar44->DC).NavLayersActiveMask & 2) == 0)) {
              pIVar29->NavLastIds[1] = IVar27;
            }
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 < (node->Windows).Size);
      }
      lVar43 = 0;
      do {
        uVar50 = *(undefined8 *)(local_c8 + lVar43 * 4);
        uVar18 = *(undefined8 *)((long)&uStack_c0 + lVar43 * 4);
        pIVar45 = (pIVar21->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar43);
        pIVar45->x = (float)(int)uVar50;
        pIVar45->y = (float)(int)((ulong)uVar50 >> 0x20);
        pIVar45->z = (float)(int)uVar18;
        pIVar45->w = (float)(int)((ulong)uVar18 >> 0x20);
        lVar43 = lVar43 + 4;
      } while (lVar43 != 0x18);
      if ((node->VisibleWindow != (ImGuiWindow *)0x0) &&
         (((char)local_174 != '\0' || (local_60->VisibleWindow == (ImGuiWindow *)0x0)))) {
        local_60->VisibleWindow = node->VisibleWindow;
      }
      if (((*(uint *)&node->field_0xbc >> 0xb & 1) == 0) ||
         (node->VisibleWindow == (ImGuiWindow *)0x0)) {
        cVar49 = '\0';
      }
      else {
        cVar49 = node->VisibleWindow->HasCloseButton;
      }
      if ((*(uint *)&node->field_0xbc >> 0xb & 1) != 0) {
        if (cVar49 == '\0') {
          PushItemFlag(4,true);
          local_d8.w = (pIVar21->Style).Colors[0].w * 0.4;
          local_d8.x = (pIVar21->Style).Colors[0].x;
          local_d8.y = (pIVar21->Style).Colors[0].y;
          local_d8.z = (pIVar21->Style).Colors[0].z;
          PushStyleColor(0,&local_d8);
        }
        IVar27 = ImGuiWindow::GetID(pIVar29,"#CLOSE",(char *)0x0);
        bVar22 = CloseButton(IVar27,&local_58);
        if ((bVar22) && (node->field_0xbd = node->field_0xbd | 0x40, 0 < (this->Tabs).Size)) {
          lVar43 = 0;
          lVar47 = 0;
          do {
            TabBarCloseTab(this,(ImGuiTabItem *)((long)&((this->Tabs).Data)->ID + lVar43));
            lVar47 = lVar47 + 1;
            lVar43 = lVar43 + 0x30;
          } while (lVar47 < (this->Tabs).Size);
        }
        if (cVar49 == '\0') {
          PopStyleColor(1);
          PopItemFlag();
        }
      }
      IVar27 = ImGuiWindow::GetID(pIVar29,"#TITLEBAR",(char *)0x0);
      if (((pIVar21->HoveredId == 0) || (pIVar21->HoveredId == IVar27)) ||
         (pIVar46 = local_120, pIVar21->ActiveId == IVar27)) {
        ButtonBehavior(&local_138,IVar27,(bool *)0x0,(bool *)&local_d8,0x1000);
        if (pIVar21->HoveredId == IVar27) {
          (pIVar21->LastItemData).ID = IVar27;
          pIVar46 = GImGui;
          IVar27 = (GImGui->LastItemData).ID;
          if (GImGui->HoveredId == IVar27) {
            GImGui->HoveredIdAllowOverlap = true;
          }
          if (pIVar46->ActiveId == IVar27) {
            pIVar46->ActiveIdAllowOverlap = true;
          }
        }
        pIVar46 = local_120;
        if (local_d8.x._0_1_ == '\x01') {
          fVar34 = (GImGui->IO).MouseDownDuration[0];
          if ((fVar34 == 0.0) && (!NAN(fVar34))) {
            IVar25 = this->SelectedTabId;
          }
          pIVar30 = TabBarFindTabByID(this,this->SelectedTabId);
          pIVar46 = local_120;
          if (pIVar30 != (ImGuiTabItem *)0x0) {
            pIVar44 = pIVar30->Window;
            if (pIVar44 == (ImGuiWindow *)0x0) {
              pIVar44 = node->HostWindow;
            }
            StartMouseMovingWindowOrNode(pIVar44,node,false);
          }
        }
      }
      if (this->NextSelectedTabId != 0) {
        IVar25 = this->NextSelectedTabId;
      }
      if (((IVar25 != 0) &&
          (pIVar30 = TabBarFindTabByID(this,IVar25), pIVar30 != (ImGuiTabItem *)0x0)) &&
         (pIVar30->Window != (ImGuiWindow *)0x0)) {
        FocusWindow(pIVar30->Window);
        NavInitWindow(pIVar30->Window,false);
      }
      EndTabBar();
      PopID();
      if ((node->MergedFlags & 0x400) == 0) {
        (pIVar29->DC).NavLayerCurrent = ImGuiNavLayer_Main;
        pIVar29->SkipItems = bVar53;
      }
    }
    else {
      pIVar44 = *(node->Windows).Data;
      node->VisibleWindow = pIVar44;
      *(ushort *)&node->field_0xbc = uVar1 & 0xbbff | (ushort)(local_174 << 10);
      if (bVar48 != 0) {
        node->LastFrameFocused = pIVar21->FrameCount;
      }
      if (pIVar44 != (ImGuiWindow *)0x0) {
        if ((bVar48 != 0) || (pIVar39->VisibleWindow == (ImGuiWindow *)0x0)) {
          pIVar39->VisibleWindow = pIVar44;
        }
        if (node->TabBar != (ImGuiTabBar *)0x0) {
          node->TabBar->VisibleTabId = node->VisibleWindow->ID;
        }
      }
    }
  }
  if ((node->TabBar == (ImGuiTabBar *)0x0) || (IVar27 = node->TabBar->SelectedTabId, IVar27 == 0)) {
    if ((node->Windows).Size < 1) goto LAB_0014249b;
    IVar27 = (*(node->Windows).Data)->ID;
  }
  node->SelectedTabId = IVar27;
LAB_0014249b:
  if (pIVar29 == (ImGuiWindow *)0x0) {
    node->LastFrameActive = pIVar46->FrameCount;
    cVar49 = (char)local_e0;
  }
  else {
    if ((((node->field_0xbd & 2) != 0) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
       ((pIVar46->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIVar46->MovingWindow->RootWindowDockTree != pIVar29)))) {
      BeginDockableDragDropTarget(pIVar29);
    }
    node->LastFrameActive = pIVar46->FrameCount;
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[0]);
    }
    cVar49 = (char)local_e0;
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[1]);
    }
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      RenderWindowOuterBorders(pIVar29);
    }
  }
  if (cVar49 != '\0') {
    End();
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->IsFloatingNode())
    {
        if (node->Windows.Size <= 1 && node->IsLeafNode())
            if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
                want_to_hide_host_window = true;
        if (node->CountNodeWithWindows == 0)
            want_to_hide_host_window = true;
    }
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->MergedFlags;

    // Decide if the node will have a close button and a window menu button
    node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
    node->HasCloseButton = false;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
        ImGuiWindow* window = node->Windows[window_n];
        node->HasCloseButton |= window->HasCloseButton;
        window->DockIsActive = (node->Windows.Size > 1);
    }
    if (node_flags & ImGuiDockNodeFlags_NoCloseButton)
        node->HasCloseButton = false;

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            host_window = g.CurrentWindow;
            DockNodeSetupHostWindow(node, host_window);
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindow->DockNode && g.NavWindow->RootWindow->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindow->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size
    // _after_ processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // We add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        // (But we only add it if there's something else on the other side of the hole, otherwise for e.g. fullscreen
        // covering passthru node we'd have a gap on the edge not covered by the hole)
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImGuiDockNode* root_node = DockNodeGetRootNode(central_node);
        ImRect root_rect(root_node->Pos, root_node->Pos + root_node->Size);
        ImRect hole_rect(central_node->Pos, central_node->Pos + central_node->Size);
        if (hole_rect.Min.x > root_rect.Min.x) { hole_rect.Min.x += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.x < root_rect.Max.x) { hole_rect.Max.x -= WINDOWS_HOVER_PADDING; }
        if (hole_rect.Min.y > root_rect.Min.y) { hole_rect.Min.y += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.y < root_rect.Max.y) { hole_rect.Max.y -= WINDOWS_HOVER_PADDING; }
        //GetForegroundDrawList()->AddRect(hole_rect.Min, hole_rect.Max, IM_COL32(255, 0, 0, 255));
        if (central_node_hole && !hole_rect.IsInverted())
        {
            SetWindowHitTestHole(host_window, hole_rect.Min, hole_rect.Max - hole_rect.Min);
            SetWindowHitTestHole(host_window->ParentWindow, hole_rect.Min, hole_rect.Max - hole_rect.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindowDockTree != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}